

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeEnter(Vdbe *p)

{
  Db *pDVar1;
  Btree *p_00;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (p->lockMask != 0) {
    pDVar1 = p->db->aDb;
    uVar2 = p->db->nDb;
    uVar3 = 0;
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar4 = uVar3;
    }
    uVar2 = 1;
    for (; uVar4 * 0x20 != uVar3; uVar3 = uVar3 + 0x20) {
      if (((uVar3 != 0x20) && ((p->lockMask & uVar2) != 0)) &&
         (p_00 = *(Btree **)((long)&pDVar1->pBt + uVar3), p_00 != (Btree *)0x0)) {
        sqlite3BtreeEnter(p_00);
      }
      uVar2 = uVar2 * 2;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeEnter(Vdbe *p){
  int i;
  yDbMask mask;
  sqlite3 *db;
  Db *aDb;
  int nDb;
  if( p->lockMask==0 ) return;  /* The common case */
  db = p->db;
  aDb = db->aDb;
  nDb = db->nDb;
  for(i=0, mask=1; i<nDb; i++, mask += mask){
    if( i!=1 && (mask & p->lockMask)!=0 && ALWAYS(aDb[i].pBt!=0) ){
      sqlite3BtreeEnter(aDb[i].pBt);
    }
  }
}